

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

ostream * absl::lts_20250127::operator<<(ostream *os,uint128 v)

{
  uint uVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  char cVar5;
  ulong uVar6;
  fmtflags in_R8D;
  size_t count;
  long lVar7;
  uint128 v_00;
  string rep;
  string local_50;
  
  v_00.lo_ = v.hi_;
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  v_00.hi_._0_4_ = uVar1;
  v_00.hi_._4_4_ = 0;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_(&local_50,(void *)v.lo_,v_00,in_R8D);
  lVar2 = *(long *)os;
  uVar6 = *(ulong *)(os + *(long *)(lVar2 + -0x18) + 0x10);
  *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 0;
  lVar7 = uVar6 - local_50._M_string_length;
  if (uVar6 < local_50._M_string_length || lVar7 == 0) goto LAB_002e2ee5;
  cVar5 = (char)lVar7;
  if (((byte)uVar1 & 0xb0) == 0x10) {
    if (((uVar1 & 0x24a) != 0x208) || ((void *)v.lo_ == (void *)0x0 && v_00.lo_ == 0))
    goto LAB_002e2e9c;
    poVar4 = os + *(long *)(lVar2 + -0x18);
    uVar6 = 2;
    if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar4);
      uVar6 = 2;
      goto LAB_002e2ec1;
    }
  }
  else {
    if ((uVar1 & 0xb0) == 0x20) {
      poVar4 = os + *(long *)(lVar2 + -0x18);
      if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar4);
        poVar4[0xe0] = oVar3;
        poVar4[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,cVar5);
      goto LAB_002e2ee5;
    }
LAB_002e2e9c:
    poVar4 = os + *(long *)(lVar2 + -0x18);
    if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar4);
      uVar6 = 0;
LAB_002e2ec1:
      poVar4[0xe0] = oVar3;
      poVar4[0xe1] = (ostream)0x1;
    }
    else {
      uVar6 = 0;
    }
  }
  std::__cxx11::string::insert((ulong)&local_50,uVar6,cVar5);
LAB_002e2ee5:
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return poVar4;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(count, os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(size_t{2}, count, os.fill());
    } else {
      rep.insert(size_t{0}, count, os.fill());
    }
  }

  return os << rep;
}